

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeToPDFForm.cpp
# Opt level: O2

int MergeToPDFForm(int argc,char **argv)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFPage *this;
  PDFParsingOptions *inOptions;
  PDFDocumentCopyingContext *this_00;
  PDFFormXObject *this_01;
  XObjectContentContext *this_02;
  ObjectIDType inFormXObjectID;
  PageContentContext *inPageContext;
  ResourcesDictionary *this_03;
  uint uVar3;
  allocator<char> local_103a;
  allocator<char> local_1039;
  string local_1038;
  string local_1018;
  string formName;
  undefined1 local_f98 [48];
  string local_f68;
  string local_f48;
  EncryptionOptions local_f28;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1038,"MergeToPDFForm.pdf",&local_1039);
  BuildRelativeOutputPath(&local_1018,argv,&local_1038);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f68,"MergeToPDFForm.txt",&local_103a);
  BuildRelativeOutputPath(&local_f48,argv,&local_f68);
  uVar3 = 1;
  LogConfiguration::LogConfiguration((LogConfiguration *)local_f98,true,true,&local_f48);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f28,pEVar2);
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&formName._M_string_length,&local_f28);
  formName._M_dataplus._M_p._0_2_ = 0x101;
  EVar1 = PDFWriter::StartPDF(&pdfWriter,&local_1018,ePDFVersion13,(LogConfiguration *)local_f98,
                              (PDFCreationSettings *)&formName);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&formName._M_string_length);
  EncryptionOptions::~EncryptionOptions(&local_f28);
  std::__cxx11::string::~string((string *)(local_f98 + 8));
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string((string *)&local_1018);
  std::__cxx11::string::~string((string *)&local_1038);
  if (EVar1 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)&formName,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)&formName);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&formName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1038,"Linearized.pdf",(allocator<char> *)&local_f68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f98,argv[1],(allocator<char> *)&local_f48);
    LocalPathToFileURL((FileURL *)&formName,(string *)local_f98);
    RelativeURLToLocalPath(&local_1018,(FileURL *)&formName,&local_1038);
    FileURL::~FileURL((FileURL *)&formName);
    std::__cxx11::string::~string((string *)local_f98);
    inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    this_00 = PDFWriter::CreatePDFCopyingContext(&pdfWriter,&local_1018,inOptions);
    std::__cxx11::string::~string((string *)&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    PDFRectangle::PDFRectangle((PDFRectangle *)&formName,0.0,0.0,297.5,842.0);
    this_01 = PDFWriter::StartFormXObject(&pdfWriter,(PDFRectangle *)&formName,(double *)0x0);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&formName);
    uVar3 = 1;
    if (this_01 != (PDFFormXObject *)0x0) {
      this_02 = PDFFormXObject::GetContentContext(this_01);
      AbstractContentContext::q(&this_02->super_AbstractContentContext);
      AbstractContentContext::cm(&this_02->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,0.0);
      EVar1 = PDFDocumentCopyingContext::MergePDFPageToFormXObject(this_00,this_01,1);
      if (EVar1 == eSuccess) {
        AbstractContentContext::Q(&this_02->super_AbstractContentContext);
        AbstractContentContext::q(&this_02->super_AbstractContentContext);
        AbstractContentContext::cm(&this_02->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0)
        ;
        EVar1 = PDFDocumentCopyingContext::MergePDFPageToFormXObject(this_00,this_01,0);
        if (EVar1 == eSuccess) {
          AbstractContentContext::Q(&this_02->super_AbstractContentContext);
          inFormXObjectID = PDFFormXObject::GetObjectID(this_01);
          EVar1 = PDFWriter::EndFormXObjectAndRelease(&pdfWriter,this_01);
          if (EVar1 == eSuccess) {
            inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
            this_03 = PDFPage::GetResourcesDictionary(this);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_(&formName,this_03,inFormXObjectID)
            ;
            AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
            AbstractContentContext::Do(&inPageContext->super_AbstractContentContext,&formName);
            AbstractContentContext::cm
                      (&inPageContext->super_AbstractContentContext,1.0,0.0,0.0,1.0,297.5,0.0);
            AbstractContentContext::Do(&inPageContext->super_AbstractContentContext,&formName);
            AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
            EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
            uVar3 = 1;
            if (EVar1 == eSuccess) {
              EVar1 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
              if (EVar1 == eSuccess) {
                EVar1 = PDFWriter::EndPDF(&pdfWriter);
                uVar3 = (uint)(EVar1 != eSuccess);
              }
            }
            std::__cxx11::string::~string((string *)&formName);
          }
        }
      }
    }
    if (this_00 != (PDFDocumentCopyingContext *)0x0) {
      PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this_00);
      goto LAB_00137312;
    }
  }
  this_00 = (PDFDocumentCopyingContext *)0x0;
LAB_00137312:
  operator_delete(this_00,0xd0);
  PDFWriter::~PDFWriter(&pdfWriter);
  return uVar3;
}

Assistant:

int MergeToPDFForm(int argc, char* argv[])
{
	PDFWriter pdfWriter;
	EStatusCode status;
    PDFDocumentCopyingContext* copyingContext = NULL;
    
	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"MergeToPDFForm.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,BuildRelativeOutputPath(argv,"MergeToPDFForm.txt")));
		if(status != PDFHummus::eSuccess)
			break;
        
        
        // in this test we will merge 2 pages into a PDF form, and place it twice, forming a 2X2 design. amazing.
        
		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
        
        
        copyingContext = pdfWriter.CreatePDFCopyingContext(BuildRelativeInputPath(argv,"Linearized.pdf"));
        if(status != PDFHummus::eSuccess)
            break;
        
        // create form for two pages.
        PDFFormXObject* newFormXObject = pdfWriter.StartFormXObject(PDFRectangle(0,0,297.5,842));
        if(!newFormXObject)
        {
            status = PDFHummus::eFailure;
            break;
        }
        
		XObjectContentContext* xobjectContentContext = newFormXObject->GetContentContext();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,0);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,1);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,421);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,0);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        ObjectIDType formID = newFormXObject->GetObjectID();
        status = pdfWriter.EndFormXObjectAndRelease(newFormXObject);
        if(status != eSuccess)
            break;
        
        // now place it in the page
        PageContentContext* pageContentContext = pdfWriter.StartPageContentContext(page);
        
        
        string formName = page->GetResourcesDictionary().AddFormXObjectMapping(formID);
  
        pageContentContext->q();
        pageContentContext->Do(formName);
        pageContentContext->cm(1,0,0,1,297.5,0);
        pageContentContext->Do(formName);
        pageContentContext->Q();
        
        status = pdfWriter.EndPageContentContext(pageContentContext);
        if(status != eSuccess)
            break;
        
		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
			break;
        
		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
			break;
	}while(false);
    
    delete copyingContext;
	
	return status == eSuccess ? 0:1;
}